

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

uint * RDL_getEdgesURF(RDL_data *data,uint index)

{
  uint bcc_index;
  uint urf_internal_index;
  uint uVar1;
  RDL_graph *pRVar2;
  char *edges;
  void *__ptr;
  uint *puVar3;
  uint rcf_internal_index;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  bcc_index = data->urf_to_bcc[index][0];
  urf_internal_index = data->urf_to_bcc[index][1];
  pRVar2 = data->bccGraphs->bcc_graphs[bcc_index];
  edges = (char *)calloc(1,(ulong)pRVar2->E);
  uVar1 = data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[urf_internal_index];
  __ptr = malloc(0x100);
  for (rcf_internal_index = 0; uVar1 != rcf_internal_index;
      rcf_internal_index = rcf_internal_index + 1) {
    RDL_getEdges_internal(data,bcc_index,urf_internal_index,rcf_internal_index,edges);
  }
  uVar5 = 0x40;
  uVar7 = 0;
  for (uVar4 = 0; iVar6 = (int)uVar7, uVar4 < pRVar2->E; uVar4 = uVar4 + 1) {
    uVar8 = uVar7;
    if (edges[uVar4] == '\x01') {
      if (iVar6 == (int)uVar5) {
        uVar5 = (ulong)(uint)((int)uVar5 * 2);
        __ptr = realloc(__ptr,uVar5 * 4);
      }
      uVar8 = (ulong)(iVar6 + 1);
      *(uint *)((long)__ptr + uVar7 * 4) = data->bccGraphs->edge_from_bcc_mapping[bcc_index][uVar4];
    }
    uVar7 = uVar8;
  }
  puVar3 = (uint *)realloc(__ptr,(ulong)(iVar6 + 1) << 2);
  puVar3[uVar7] = 0xffffffff;
  free(edges);
  return puVar3;
}

Assistant:

static unsigned *RDL_getEdgesURF(const RDL_data *data, unsigned index)
{
  unsigned i,nofFams,nextfree=0,alloced, bcc_index, internal_index;
  char *edges;
  unsigned *result;
  const RDL_graph* graph;

  /* map indices */
  bcc_index = data->urf_to_bcc[index][0];
  internal_index = data->urf_to_bcc[index][1];
  graph = data->bccGraphs->bcc_graphs[bcc_index];
  edges = malloc(graph->E * sizeof(*edges));
  memset(edges, 0, graph->E * sizeof(*edges));

  nofFams = data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[internal_index];
  alloced = RDL_RESERVED_START;
  result = malloc(alloced * sizeof(*result));

  /* iterate over all RCFs in this URF and collect results in bitset (edges) */
  for(i=0; i<nofFams; ++i) {
    RDL_getEdges_internal(data, bcc_index, internal_index, i, edges);
  }

  /* translate into dynamic table */
  for(i=0; i<graph->E; ++i) {
    if(edges[i] == 1) {
      if(nextfree == alloced)
      {/*double the size*/
        alloced *= 2;
        result = realloc(result, alloced*sizeof(*result));
      }
      result[nextfree++] = data->bccGraphs->edge_from_bcc_mapping[bcc_index][i];
    }
  }
  result = realloc(result, (nextfree+1)*sizeof(*result));

  result[nextfree] = UINT_MAX;

  free(edges);
  return result;
}